

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupportTest.cpp
# Opt level: O2

void __thiscall
TEST_GROUP_CppUTestGroupMockSupportTest::teardown(TEST_GROUP_CppUTestGroupMockSupportTest *this)

{
  MockSupport *pMVar1;
  SimpleString SStack_18;
  
  SimpleString::SimpleString(&SStack_18,"");
  pMVar1 = mock(&SStack_18,(MockFailureReporter *)0x0);
  (*pMVar1->_vptr_MockSupport[0x25])(pMVar1);
  SimpleString::~SimpleString(&SStack_18);
  CHECK_NO_MOCK_FAILURE_LOCATION
            ("/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupportTest.cpp"
             ,0x2b);
  MockFailureReporterForTest::clearReporter();
  SimpleString::SimpleString(&SStack_18,"");
  pMVar1 = mock(&SStack_18,(MockFailureReporter *)0x0);
  (*pMVar1->_vptr_MockSupport[0x27])(pMVar1);
  SimpleString::~SimpleString(&SStack_18);
  return;
}

Assistant:

void teardown() _override
  {
      mock().checkExpectations();
      CHECK_NO_MOCK_FAILURE();
      MockFailureReporterForTest::clearReporter();
      mock().clear();
  }